

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::OgreBinarySerializer::ReadMesh(OgreBinarySerializer *this,Mesh *mesh)

{
  uchar uVar1;
  ushort uVar2;
  uint uVar3;
  Logger *pLVar4;
  ushort uVar5;
  VertexData *dest;
  StreamReader<false,_false> *pSVar6;
  bool bVar7;
  long *local_1d0;
  long local_1c0 [2];
  char *local_1b0;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [112];
  ios_base local_138 [264];
  
  uVar1 = StreamReader<false,_false>::Get<unsigned_char>(this->m_reader);
  mesh->hasSkeletalAnimations = uVar1 != '\0';
  pLVar4 = DefaultLogger::get();
  Logger::debug(pLVar4,"Reading Mesh");
  pLVar4 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[26]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [26])"  - Skeletal animations: ");
  local_1b0 = "false";
  if (mesh->hasSkeletalAnimations != false) {
    local_1b0 = "true";
  }
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
            (local_1a8,&local_1b0);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar4,(char *)local_1d0);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  dest = (VertexData *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar6 = this->m_reader;
  if (*(int *)&pSVar6->end != *(int *)&pSVar6->current) {
    uVar2 = StreamReader<false,_false>::Get<unsigned_short>(pSVar6);
    uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar3;
    pSVar6 = this->m_reader;
    bVar7 = *(int *)&pSVar6->end == *(int *)&pSVar6->current;
    while (!bVar7) {
      uVar5 = uVar2 << 4 | (uVar2 ^ 0x8000) >> 0xc;
      if ((0xf < uVar5) || ((0xf07fU >> (uVar5 & 0x1f) & 1) == 0)) {
        if (!bVar7) {
          StreamReader<false,_false>::IncPtr(pSVar6,-6);
        }
        break;
      }
      switch(uVar2 - 0x4000 >> 0xc) {
      case 0:
        dest = (VertexData *)mesh;
        ReadSubMesh(this,mesh);
        break;
      case 1:
        dest = (VertexData *)operator_new(200);
        VertexData::VertexData(dest);
        mesh->sharedVertexData = dest;
        ReadGeometry(this,dest);
        break;
      case 2:
        dest = (VertexData *)mesh;
        ReadMeshSkeletonLink(this,mesh);
        break;
      case 3:
        dest = mesh->sharedVertexData;
        ReadBoneAssignment(this,dest);
        break;
      case 4:
        dest = (VertexData *)mesh;
        ReadMeshLodInfo(this,mesh);
        break;
      case 5:
        dest = (VertexData *)0x1c;
        goto LAB_004b6db8;
      case 6:
        dest = (VertexData *)mesh;
        ReadSubMeshNames(this,mesh);
        break;
      case 7:
        ReadEdgeList(this,(Mesh *)dest);
        break;
      case 8:
        dest = (VertexData *)mesh;
        ReadPoses(this,mesh);
        break;
      case 9:
        dest = (VertexData *)mesh;
        ReadAnimations(this,mesh);
        break;
      case 10:
        dest = (VertexData *)((ulong)this->m_currentLen - 6);
LAB_004b6db8:
        StreamReader<false,_false>::IncPtr(pSVar6,(intptr_t)dest);
      }
      pSVar6 = this->m_reader;
      if (*(int *)&pSVar6->end != *(int *)&pSVar6->current) {
        uVar2 = StreamReader<false,_false>::Get<unsigned_short>(pSVar6);
        uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
        this->m_currentLen = uVar3;
      }
      pSVar6 = this->m_reader;
      bVar7 = *(int *)&pSVar6->end == *(int *)&pSVar6->current;
    }
  }
  NormalizeBoneWeights((OgreBinarySerializer *)pSVar6,mesh->sharedVertexData);
  return;
}

Assistant:

void OgreBinarySerializer::ReadMesh(Mesh *mesh)
{
    mesh->hasSkeletalAnimations = Read<bool>();

    ASSIMP_LOG_DEBUG("Reading Mesh");
    ASSIMP_LOG_DEBUG_F( "  - Skeletal animations: ", mesh->hasSkeletalAnimations ? "true" : "false" );

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() &&
            (id == M_GEOMETRY ||
             id == M_SUBMESH ||
             id == M_MESH_SKELETON_LINK ||
             id == M_MESH_BONE_ASSIGNMENT ||
             id == M_MESH_LOD ||
             id == M_MESH_BOUNDS ||
             id == M_SUBMESH_NAME_TABLE ||
             id == M_EDGE_LISTS ||
             id == M_POSES ||
             id == M_ANIMATIONS ||
             id == M_TABLE_EXTREMES))
        {
            switch(id)
            {
                case M_GEOMETRY:
                {
                    mesh->sharedVertexData = new VertexData();
                    ReadGeometry(mesh->sharedVertexData);
                    break;
                }
                case M_SUBMESH:
                {
                    ReadSubMesh(mesh);
                    break;
                }
                case M_MESH_SKELETON_LINK:
                {
                    ReadMeshSkeletonLink(mesh);
                    break;
                }
                case M_MESH_BONE_ASSIGNMENT:
                {
                    ReadBoneAssignment(mesh->sharedVertexData);
                    break;
                }
                case M_MESH_LOD:
                {
                    ReadMeshLodInfo(mesh);
                    break;
                }
                case M_MESH_BOUNDS:
                {
                    ReadMeshBounds(mesh);
                    break;
                }
                case M_SUBMESH_NAME_TABLE:
                {
                    ReadSubMeshNames(mesh);
                    break;
                }
                case M_EDGE_LISTS:
                {
                    ReadEdgeList(mesh);
                    break;
                }
                case M_POSES:
                {
                    ReadPoses(mesh);
                    break;
                }
                case M_ANIMATIONS:
                {
                    ReadAnimations(mesh);
                    break;
                }
                case M_TABLE_EXTREMES:
                {
                    ReadMeshExtremes(mesh);
                    break;
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }

    NormalizeBoneWeights(mesh->sharedVertexData);
}